

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRoundedBox.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChRoundedBox::ChRoundedBox(ChRoundedBox *this,ChRoundedBox *source)

{
  (this->super_ChVolume).super_ChGeometry._vptr_ChGeometry = (_func_int **)&PTR__ChGeometry_00b3f470
  ;
  (this->Size).m_data[0] = 0.0;
  (this->Size).m_data[1] = 0.0;
  (this->Size).m_data[2] = 0.0;
  if (source != this) {
    (this->Size).m_data[0] = (source->Size).m_data[0];
    (this->Size).m_data[1] = (source->Size).m_data[1];
    (this->Size).m_data[2] = (source->Size).m_data[2];
  }
  return;
}

Assistant:

ChRoundedBox::ChRoundedBox(const ChRoundedBox& source) {
    Size = source.Size;
}